

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixedContentModel.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::MixedContentModel::hasDups(MixedContentModel *this)

{
  QName *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  XMLCh *pXVar4;
  XMLCh *pXVar5;
  QName *local_30;
  XMLSize_t iIndex;
  QName *curVal;
  XMLSize_t index;
  MixedContentModel *this_local;
  
  if (this->fCount != 1) {
    for (curVal = (QName *)0x0; curVal < (QName *)this->fCount;
        curVal = (QName *)((long)&(curVal->super_XSerializable)._vptr_XSerializable + 1)) {
      this_00 = this->fChildren[(long)curVal];
      for (local_30 = (QName *)0x0; local_30 < (QName *)this->fCount;
          local_30 = (QName *)((long)&(local_30->super_XSerializable)._vptr_XSerializable + 1)) {
        if (local_30 != curVal) {
          if ((this->fDTD & 1U) == 0) {
            uVar2 = QName::getURI(this_00);
            uVar3 = QName::getURI(this->fChildren[(long)local_30]);
            if (uVar2 == uVar3) {
              pXVar4 = QName::getLocalPart(this_00);
              pXVar5 = QName::getLocalPart(this->fChildren[(long)local_30]);
              bVar1 = XMLString::equals(pXVar4,pXVar5);
              if (bVar1) {
                return true;
              }
            }
          }
          else {
            pXVar4 = QName::getRawName(this_00);
            pXVar5 = QName::getRawName(this->fChildren[(long)local_30]);
            bVar1 = XMLString::equals(pXVar4,pXVar5);
            if (bVar1) {
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool MixedContentModel::hasDups() const
{
    // Can't have dups if only one child
    if (fCount == 1)
        return false;

    for (XMLSize_t index = 0; index < fCount; index++)
    {
        const QName* curVal = fChildren[index];
        for (XMLSize_t iIndex = 0; iIndex < fCount; iIndex++)
        {
            if (iIndex == index)
                continue;

            if (fDTD) {
                if (XMLString::equals(curVal->getRawName(), fChildren[iIndex]->getRawName())) {
                    return true;
                }
            }
            else {
                if ((curVal->getURI() == fChildren[iIndex]->getURI()) &&
                    (XMLString::equals(curVal->getLocalPart(), fChildren[iIndex]->getLocalPart()))) {
                    return true;
                }
            }
        }
    }
    return false;
}